

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O2

uint32_t utf8_len(char *s,uint32_t nbytes)

{
  uint32_t uVar1;
  size_t sVar2;
  uint32_t uVar3;
  uint32_t i;
  
  if (nbytes == 0) {
    sVar2 = strlen(s);
    nbytes = (uint32_t)sVar2;
  }
  i = 0;
  uVar3 = 0;
  do {
    if (nbytes <= i) {
      return uVar3;
    }
    uVar3 = uVar3 + 1;
    uVar1 = utf8_charbytes(s,i);
    i = i + uVar1;
  } while (uVar1 != 0);
  return 0;
}

Assistant:

uint32_t utf8_len (const char *s, uint32_t nbytes) {
    if (nbytes == 0) nbytes = (uint32_t)strlen(s);
    
    uint32_t pos = 0;
    uint32_t len = 0;
    
    while (pos < nbytes) {
        ++len;
        uint32_t n = utf8_charbytes(s, pos);
        if (n == 0) return 0; // means error
        pos += n;
    }
    
    return len;
}